

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.H
# Opt level: O2

void __thiscall pele::physics::reactions::ReactorCvode::ReactorCvode(ReactorCvode *this)

{
  (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose = 0;
  memset(&(this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
          m_typ_vals,0,0xb0);
  (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
  super_Factory<pele::physics::reactions::ReactorBase>._vptr_Factory =
       (_func_int **)&PTR__Register_007d2688;
  this->relTol = 1e-06;
  this->absTol = 1e-10;
  this->m_reactor_type = 0;
  this->atomic_reductions = 1;
  this->max_nls_iters = 3;
  this->max_fp_accel = 2;
  this->m_clean_init_massfrac = false;
  this->y = (N_Vector)0x0;
  this->LS = (SUNLinearSolver)0x0;
  this->NLS = (SUNNonlinearSolver)0x0;
  this->A = (SUNMatrix)0x0;
  this->cvode_mem = (void *)0x0;
  this->udata_g = (CVODEUserData *)0x0;
  return;
}

Assistant:

static std::string identifier() { return "ReactorCvode"; }